

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

spv_result_t
spvOpcodeTableNameLookup
          (spv_target_env env,spv_opcode_table table,char *name,spv_opcode_desc *pEntry)

{
  uint32_t uVar1;
  int iVar2;
  size_t __n;
  spv_opcode_desc psVar3;
  size_t sVar4;
  spv_opcode_desc_t *entry;
  uint64_t opcodeIndex;
  uint32_t version;
  size_t nameLength;
  spv_opcode_desc *pEntry_local;
  char *name_local;
  spv_opcode_table table_local;
  spv_target_env env_local;
  
  if ((name == (char *)0x0) || (pEntry == (spv_opcode_desc *)0x0)) {
    table_local._4_4_ = SPV_ERROR_INVALID_POINTER;
  }
  else if (table == (spv_opcode_table)0x0) {
    table_local._4_4_ = SPV_ERROR_INVALID_TABLE;
  }
  else {
    __n = strlen(name);
    uVar1 = spvVersionForTargetEnv(env);
    for (entry = (spv_opcode_desc_t *)0x0; entry < (spv_opcode_desc_t *)(ulong)table->count;
        entry = (spv_opcode_desc_t *)((long)&entry->name + 1)) {
      psVar3 = table->entries + (long)entry;
      if (((((psVar3->minVersion <= uVar1) && (uVar1 <= psVar3->lastVersion)) ||
           (psVar3->numExtensions != 0)) || (psVar3->numCapabilities != 0)) &&
         ((sVar4 = strlen(psVar3->name), __n == sVar4 &&
          (iVar2 = strncmp(name,psVar3->name,__n), iVar2 == 0)))) {
        *pEntry = psVar3;
        return SPV_SUCCESS;
      }
    }
    table_local._4_4_ = SPV_ERROR_INVALID_LOOKUP;
  }
  return table_local._4_4_;
}

Assistant:

spv_result_t spvOpcodeTableNameLookup(spv_target_env env,
                                      const spv_opcode_table table,
                                      const char* name,
                                      spv_opcode_desc* pEntry) {
  if (!name || !pEntry) return SPV_ERROR_INVALID_POINTER;
  if (!table) return SPV_ERROR_INVALID_TABLE;

  // TODO: This lookup of the Opcode table is suboptimal! Binary sort would be
  // preferable but the table requires sorting on the Opcode name, but it's
  // static const initialized and matches the order of the spec.
  const size_t nameLength = strlen(name);
  const auto version = spvVersionForTargetEnv(env);
  for (uint64_t opcodeIndex = 0; opcodeIndex < table->count; ++opcodeIndex) {
    const spv_opcode_desc_t& entry = table->entries[opcodeIndex];
    // We considers the current opcode as available as long as
    // 1. The target environment satisfies the minimal requirement of the
    //    opcode; or
    // 2. There is at least one extension enabling this opcode.
    //
    // Note that the second rule assumes the extension enabling this instruction
    // is indeed requested in the SPIR-V code; checking that should be
    // validator's work.
    if (((version >= entry.minVersion && version <= entry.lastVersion) ||
         entry.numExtensions > 0u || entry.numCapabilities > 0u) &&
        nameLength == strlen(entry.name) &&
        !strncmp(name, entry.name, nameLength)) {
      // NOTE: Found out Opcode!
      *pEntry = &entry;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}